

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distance.cpp
# Opt level: O0

double Distance::getRobinsonFouldsDistance(PhyloTree *t1,PhyloTree *t2,bool normalise)

{
  double dVar1;
  size_type sVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  byte in_DL;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *unaff_retaddr;
  PhyloTree *in_stack_00000008;
  PhyloTree *in_stack_00000010;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> enic;
  double rf_value;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *this;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_38;
  double local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_20 = 0.0;
  this = &local_38;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x18ad0e);
  PhyloTree::getEdgesNotInCommonWith(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  PhyloTree::getEdgesNotInCommonWith(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  sVar2 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(&local_38);
  auVar6._8_4_ = (int)(sVar2 >> 0x20);
  auVar6._0_8_ = sVar2;
  auVar6._12_4_ = 0x45300000;
  local_20 = (auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
  if ((local_11 & 1) != 0) {
    sVar3 = PhyloTree::numEdges((PhyloTree *)0x18ad86);
    sVar4 = PhyloTree::numEdges((PhyloTree *)0x18ad97);
    lVar5 = sVar3 + sVar4;
    auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = 0x45300000;
    local_20 = local_20 /
               ((auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
  }
  dVar1 = local_20;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(this);
  return dVar1;
}

Assistant:

double Distance::getRobinsonFouldsDistance(PhyloTree &t1, PhyloTree &t2, bool normalise) {
    double rf_value = 0;
    vector<PhyloTreeEdge> enic;
    t1.getEdgesNotInCommonWith(t2, enic);
    t2.getEdgesNotInCommonWith(t1, enic);
    rf_value = enic.size();
    if (normalise)
        rf_value /= t1.numEdges() + t2.numEdges();
    return rf_value;
}